

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

ostream * amrex::operator<<(ostream *os,PP_entry *pp)

{
  pointer pbVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(pp->m_name)._M_dataplus._M_p,(pp->m_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(nvals = ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," :: [",5);
  uVar3 = (long)(pp->m_vals).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pp->m_vals).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)(uVar3 >> 5);
  if (0 < (int)uVar5) {
    lVar4 = 8;
    uVar6 = 0;
    do {
      pbVar1 = (pp->m_vals).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                (os,*(char **)((long)pbVar1 + lVar4 + -8),
                 *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      if ((long)uVar6 < (long)(uVar3 * 0x8000000 + -0x100000000) >> 0x20) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x20;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("write on ostream failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const ParmParse::PP_entry& pp)
{
    os << pp.m_name << "(nvals = " << pp.m_vals.size() << ") " << " :: [";
    int n = pp.m_vals.size();
    for ( int i = 0; i < n; i++ )
    {
        os << pp.m_vals[i];
        if ( i < n-1 ) os << ", ";
    }
    os << "]";

    if ( !os )
    {
        amrex::Error("write on ostream failed");
    }
    return os;
}